

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::commitTexturePage
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  uint uVar1;
  GLenum err;
  ostream *poVar2;
  TestError *this_00;
  int local_60;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  uint local_44;
  GLuint *pGStack_40;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureCommitmentTestCase *this_local;
  
  local_44 = level;
  pGStack_40 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar2 = std::operator<<((ostream *)&this->field_0x88,"Commit Region [level: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_44);
  std::operator<<(poVar2,"] - ");
  if ((int)local_44 <= (this->mState).levels + -1) {
    uVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                      (this,(ulong)texture_local._4_4_,(ulong)local_44);
    if (((uVar1 & 1) == 0) ||
       (uVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                          (this,(ulong)texture_local._4_4_,(ulong)local_44), (uVar1 & 1) == 0)) {
      poVar2 = std::operator<<((ostream *)&this->field_0x88,"Skip commitment [level: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_44);
      std::operator<<(poVar2,"] - ");
      this_local._7_1_ = false;
    }
    else {
      SparseTextureUtils::getTextureLevelSize
                (texture_local._4_4_,&this->mState,local_44,&depth,&widthCommitted,&local_60);
      if (texture_local._4_4_ == 0x8513) {
        local_60 = local_60 * 6;
      }
      gl4cts::Texture::Bind(_format_local,*pGStack_40,texture_local._4_4_);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,pGStack_40
                 ,(ulong)local_44,0,0,0,depth / 2,widthCommitted,local_60,1);
      err = (*_format_local->getError)();
      glu::checkError(err,"texPageCommitment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x84e);
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
             ,0x839);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SparseTextureCommitmentTestCase::commitTexturePage(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	mLog << "Commit Region [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	// Avoid not allowed commitments
	if (!isInPageSizesRange(target, level) || !isPageSizesMultiplication(target, level))
	{
		mLog << "Skip commitment [level: " << level << "] - ";
		return false;
	}

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	GLint widthCommitted = width / 2;

	Texture::Bind(gl, texture, target);
	texPageCommitment(gl, target, format, texture, level, 0, 0, 0, widthCommitted, height, depth, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texPageCommitment");

	return true;
}